

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall
Fl_Text_Display::highlight_data
          (Fl_Text_Display *this,Fl_Text_Buffer *styleBuffer,Style_Table_Entry *styleTable,
          int nStyles,char unfinishedStyle,Unfinished_Style_Cb unfinishedHighlightCB,void *cbArg)

{
  Unfinished_Style_Cb unfinishedHighlightCB_local;
  char unfinishedStyle_local;
  int nStyles_local;
  Style_Table_Entry *styleTable_local;
  Fl_Text_Buffer *styleBuffer_local;
  Fl_Text_Display *this_local;
  
  this->mStyleBuffer = styleBuffer;
  this->mStyleTable = styleTable;
  this->mNStyles = nStyles;
  this->mUnfinishedStyle = unfinishedStyle;
  this->mUnfinishedHighlightCB = unfinishedHighlightCB;
  this->mHighlightCBArg = cbArg;
  this->mColumnScale = 0.0;
  Fl_Text_Buffer::canUndo(this->mStyleBuffer,'\0');
  Fl_Widget::damage((Fl_Widget *)this,'\x02');
  return;
}

Assistant:

void Fl_Text_Display::highlight_data(Fl_Text_Buffer *styleBuffer,
                                     const Style_Table_Entry *styleTable,
                                     int nStyles, char unfinishedStyle,
                                     Unfinished_Style_Cb unfinishedHighlightCB,
                                     void *cbArg ) {
  mStyleBuffer = styleBuffer;
  mStyleTable = styleTable;
  mNStyles = nStyles;
  mUnfinishedStyle = unfinishedStyle;
  mUnfinishedHighlightCB = unfinishedHighlightCB;
  mHighlightCBArg = cbArg;
  mColumnScale = 0;

  mStyleBuffer->canUndo(0);
  damage(FL_DAMAGE_EXPOSE);
}